

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimSpecRecursively
          (Impl *this,int parent,int current,PrimSpec *parentPrimSpec,int level,
          PathIndexToSpecIndexMap *psmap,Layer *layer)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pNVar3;
  pointer pcVar4;
  uint __val;
  Type TVar5;
  map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
  *this_00;
  char cVar6;
  bool bVar7;
  ostream *poVar8;
  long lVar9;
  pointer puVar10;
  _Base_ptr p_Var11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  size_type sVar14;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  size_type sVar19;
  mapped_type *pmVar20;
  long *plVar21;
  undefined8 *puVar22;
  mapped_type *this_01;
  uint uVar23;
  _Base_ptr p_Var24;
  _Rb_tree_header *p_Var25;
  undefined1 *puVar26;
  size_type *psVar27;
  ulong uVar28;
  size_type *psVar29;
  ulong uVar30;
  Impl *this_02;
  char cVar31;
  undefined8 uVar32;
  char *pcVar33;
  uint uVar34;
  pointer piVar35;
  pointer piVar36;
  uint __len;
  int *item;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  PrimSpec *parentPrimSpec_00;
  map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
  *this_03;
  int current_local;
  int parent_local;
  map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
  *local_d50;
  size_type local_d48;
  Impl *local_d40;
  pointer local_d38;
  PrimSpec *local_d30;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> toks;
  string variantSetName;
  string __str_1;
  string __str;
  map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
  *local_c88;
  string prop_name;
  long local_c60 [10];
  ios_base local_c10 [264];
  PrimSpec variant;
  optional<tinyusdz::PrimSpec> primspec;
  
  current_local = current;
  parent_local = parent;
  if ((int)(this->_config).kMaxPrimNestLevel < level) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&primspec);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&primspec,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&primspec,"ReconstructPrimSpecRecursively",0x1e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<(&primspec,0xdd0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&primspec,"PrimSpec hierarchy is too deep.",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&variant);
    if ((size_type *)variant._0_8_ == &variant._typeName._M_string_length) goto LAB_00193ecf;
  }
  else {
    if ((-1 < current) &&
       (current < (int)((ulong)((long)(this->_nodes).
                                      super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_nodes).
                                     super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x41041041)
       ) {
      primspec.has_value_ = false;
      local_d30 = parentPrimSpec;
      memset(&primspec.contained,0,0x568);
      p_Var1 = &(this->_variantPrims)._M_t._M_impl.super__Rb_tree_header;
      p_Var24 = (this->_variantPrims)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      for (; p_Var24 != (_Base_ptr)0x0;
          p_Var24 = (&p_Var24->_M_left)[(int)p_Var24[1]._M_color < parent]) {
        if (parent <= (int)p_Var24[1]._M_color) {
          p_Var11 = p_Var24;
        }
      }
      p_Var24 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         (p_Var24 = p_Var11, parent < (int)p_Var11[1]._M_color)) {
        p_Var24 = &p_Var1->_M_header;
      }
      bVar7 = ReconstructPrimSpecNode
                        (this,parent,current,(int)p_Var24,(_Rb_tree_header *)p_Var24 != p_Var1,psmap
                         ,layer,&primspec);
      if (bVar7) {
        parentPrimSpec_00 = (PrimSpec *)0x0;
        if (primspec.has_value_ != false) {
          parentPrimSpec_00 = (PrimSpec *)&primspec.contained;
        }
        lVar9 = (long)current_local;
        pNVar3 = (this->_nodes).
                 super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar10 = pNVar3[lVar9]._children.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_d40 = this;
        if (*(pointer *)
             ((long)&pNVar3[lVar9]._children.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
            != puVar10) {
          uVar30 = 0;
          do {
            bVar7 = ReconstructPrimSpecRecursively
                              (local_d40,current_local,(int)puVar10[uVar30],parentPrimSpec_00,
                               level + 1,psmap,layer);
            if (!bVar7) goto LAB_001951d3;
            uVar30 = uVar30 + 1;
            puVar10 = pNVar3[lVar9]._children.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar30 < (ulong)((long)*(pointer *)
                                           ((long)&pNVar3[lVar9]._children.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + 8) - (long)puVar10 >> 3));
        }
        this_02 = local_d40;
        p_Var25 = &(local_d40->_variantPropChildren)._M_t._M_impl.super__Rb_tree_header;
        p_Var24 = (local_d40->_variantPropChildren)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        p_Var11 = &p_Var25->_M_header;
        for (; p_Var24 != (_Base_ptr)0x0;
            p_Var24 = (&p_Var24->_M_left)[(int)p_Var24[1]._M_color < current_local]) {
          if (current_local <= (int)p_Var24[1]._M_color) {
            p_Var11 = p_Var24;
          }
        }
        p_Var24 = &p_Var25->_M_header;
        if (((_Rb_tree_header *)p_Var11 != p_Var25) &&
           (p_Var24 = p_Var11, current_local < (int)p_Var11[1]._M_color)) {
          p_Var24 = &p_Var25->_M_header;
        }
        if ((_Rb_tree_header *)p_Var24 == p_Var25) {
LAB_001945e6:
          this_02 = local_d40;
          p_Var1 = &(local_d40->_variantPrimChildren)._M_t._M_impl.super__Rb_tree_header;
          p_Var24 = (local_d40->_variantPrimChildren)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          p_Var11 = &p_Var1->_M_header;
          for (; p_Var24 != (_Base_ptr)0x0;
              p_Var24 = (&p_Var24->_M_left)[(int)p_Var24[1]._M_color < current_local]) {
            if (current_local <= (int)p_Var24[1]._M_color) {
              p_Var11 = p_Var24;
            }
          }
          p_Var24 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
             (p_Var24 = p_Var11, current_local < (int)p_Var11[1]._M_color)) {
            p_Var24 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var24 != p_Var1) {
            if (primspec.has_value_ == false) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&variant,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<(&variant,0xe49);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              pcVar33 = "Internal error: must be Prim.";
              lVar9 = 0x1d;
              goto LAB_00195153;
            }
            pmVar13 = ::std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::at(&local_d40->_variantPrimChildren,&current_local);
            piVar36 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            piVar35 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
            if (piVar36 != piVar35) {
              local_d50 = &this_02->_variantPrimSpecs;
              local_d38 = piVar35;
              do {
                this_00 = local_d50;
                sVar19 = ::std::
                         map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                         ::count(local_d50,piVar36);
                if (sVar19 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
                  poVar8 = (ostream *)::std::ostream::operator<<(&variant,0xe52);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  pcVar33 = "Internal error: variant Prim children not found.";
                  lVar9 = 0x30;
                  goto LAB_00195153;
                }
                pmVar20 = ::std::
                          map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                          ::at(this_00,piVar36);
                bVar7 = is_variantElementName(&pmVar20->_name);
                if (!bVar7) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
                  poVar8 = (ostream *)::std::ostream::operator<<(&variant,0xe5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,
                             "Corrupted Crate. Variant Prim has invalid element_name.",0x37);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  goto LAB_0019518a;
                }
                lVar9 = 0x10;
                do {
                  puVar26 = (undefined1 *)((long)local_c60 + lVar9 + -0x20);
                  *(undefined1 **)((long)&__str.field_2 + lVar9 + 8) = puVar26;
                  *(undefined8 *)((long)&local_c88 + lVar9) = 0;
                  *puVar26 = 0;
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0x50);
                bVar7 = tokenize_variantElement
                                  (&pmVar20->_name,
                                   (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)&prop_name);
                local_d48 = CONCAT71(local_d48._1_7_,bVar7);
                if (bVar7) {
                  variant._0_8_ = &variant._typeName._M_string_length;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&variant,prop_name._M_dataplus._M_p,
                             prop_name._M_dataplus._M_p + prop_name._M_string_length);
                  toks._M_elems[0]._M_dataplus._M_p = (pointer)&toks._M_elems[0].field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&toks,local_c60[0],local_c60[1] + local_c60[0]);
                  if (primspec.has_value_ == false) {
                    __assert_fail("has_value()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                                  ,0x550,
                                  "value_type *nonstd::optional_lite::optional<tinyusdz::PrimSpec>::operator->() [T = tinyusdz::PrimSpec]"
                                 );
                  }
                  pmVar17 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                                          *)((long)&primspec.contained + 0xc0),(key_type *)&variant)
                  ;
                  if ((pmVar17->name)._M_string_length == 0) {
                    ::std::__cxx11::string::_M_assign((string *)pmVar17);
                  }
                  pmVar18 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                            ::operator[](&pmVar17->variantSet,toks._M_elems);
                  PrimMetas::operator=(&pmVar18->_metas,&pmVar20->_metas);
                  pmVar18 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                            ::operator[](&pmVar17->variantSet,toks._M_elems);
                  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::operator=
                            (&pmVar18->_children,&pmVar20->_children);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)toks._M_elems[0]._M_dataplus._M_p != &toks._M_elems[0].field_2) {
                    operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                                    toks._M_elems[0].field_2._M_allocated_capacity + 1);
                  }
                  piVar35 = local_d38;
                  cVar31 = (char)local_d48;
                  if ((size_type *)variant._0_8_ != &variant._typeName._M_string_length) {
                    operator_delete((void *)variant._0_8_,variant._typeName._M_string_length + 1);
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
                  poVar8 = (ostream *)::std::ostream::operator<<(&variant,0xe60);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"Invalid variant element_name.",0x1d);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  PushError(this_02,toks._M_elems);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)toks._M_elems[0]._M_dataplus._M_p != &toks._M_elems[0].field_2) {
                    operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                                    toks._M_elems[0].field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
                  ::std::ios_base::~ios_base
                            ((ios_base *)
                             &variant._props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                  ;
                  cVar31 = (char)local_d48;
                }
                lVar9 = -0x40;
                plVar21 = local_c60 + 2;
                do {
                  if (plVar21 != (long *)plVar21[-2]) {
                    operator_delete((long *)plVar21[-2],*plVar21 + 1);
                  }
                  plVar21 = plVar21 + -4;
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0);
                if (cVar31 == '\0') goto LAB_001951d3;
                piVar36 = piVar36 + 1;
                this_02 = local_d40;
              } while (piVar36 != piVar35);
            }
          }
          if (parent_local == 0) {
            bVar7 = true;
            if (primspec.has_value_ == true) {
              this_01 = ::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&layer->_prim_specs,
                                     (key_type *)((long)&primspec.contained + 0x28));
              if (this_01 != (mapped_type *)&primspec.contained) {
                PrimSpec::MoveFrom(this_01,(PrimSpec *)&primspec.contained);
              }
            }
          }
          else {
            sVar19 = ::std::
                     map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                     ::count(&this_02->_variantPrimSpecs,&parent_local);
            if (sVar19 == 0) {
              bVar7 = true;
              if (local_d30 != (PrimSpec *)0x0 && primspec.has_value_ == true) {
                ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
                emplace_back<tinyusdz::PrimSpec>
                          (&local_d30->_children,(PrimSpec *)&primspec.contained);
              }
            }
            else {
              if (primspec.has_value_ == false) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[warn]",6)
                ;
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&variant,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<(&variant,0xe7c);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&variant,"parent is variantPrim, but current is not Prim.",
                           0x2f);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
                ::std::__cxx11::stringbuf::str();
                PushWarn(this_02,&prop_name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
                  operator_delete(prop_name._M_dataplus._M_p,
                                  prop_name.field_2._M_allocated_capacity + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
                ::std::ios_base::~ios_base
                          ((ios_base *)
                           &variant._props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
              }
              else {
                pmVar20 = ::std::
                          map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                          ::at(&this_02->_variantPrimSpecs,&parent_local);
                if (primspec.has_value_ == false) {
                  __assert_fail("has_value()",
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                                ,0x591,
                                "value_type &nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value() [T = tinyusdz::PrimSpec]"
                               );
                }
                ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
                emplace_back<tinyusdz::PrimSpec>
                          (&pmVar20->_children,(PrimSpec *)&primspec.contained);
              }
              bVar7 = true;
            }
          }
          goto LAB_001951d5;
        }
        p_Var24 = (local_d40->_variantPrims)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var24 != (_Rb_tree_header *)0x0;
            p_Var24 = (&p_Var24->_M_left)[(int)*(size_t *)(p_Var24 + 1) < current_local]) {
          if (current_local <= (int)*(size_t *)(p_Var24 + 1)) {
            p_Var11 = p_Var24;
          }
        }
        p_Var25 = p_Var1;
        if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
           (p_Var25 = (_Rb_tree_header *)p_Var11,
           current_local < (int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
          p_Var25 = p_Var1;
        }
        if (p_Var25 == p_Var1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&variant,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<(&variant,0xe12);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          pcVar33 = "Internal error: variant attribute is not a child of VariantPrim.";
          lVar9 = 0x40;
        }
        else if (local_d30 == (PrimSpec *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&variant,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<(&variant,0xe16);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          pcVar33 = "Internal error: parentPrimSpec should exist.";
          lVar9 = 0x2c;
        }
        else {
          pmVar12 = ::std::
                    map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                    ::at(&local_d40->_variantPrims,&current_local);
          bVar7 = is_variantElementName(&(pmVar12->_elementPath)._prim_part);
          if (bVar7) {
            lVar9 = 0x10;
            do {
              puVar26 = (undefined1 *)((long)&toks._M_elems[0]._M_dataplus._M_p + lVar9);
              *(undefined1 **)((long)&local_d38 + lVar9) = puVar26;
              *(undefined8 *)((long)toks._M_elems + lVar9 + -8) = 0;
              *puVar26 = 0;
              lVar9 = lVar9 + 0x20;
            } while (lVar9 != 0x50);
            bVar7 = tokenize_variantElement(&(pmVar12->_elementPath)._prim_part,&toks);
            if (bVar7) {
              variantSetName._M_dataplus._M_p = (pointer)&variantSetName.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&variantSetName,toks._M_elems[0]._M_dataplus._M_p,
                         toks._M_elems[0]._M_dataplus._M_p + toks._M_elems[0]._M_string_length);
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str,toks._M_elems[1]._M_dataplus._M_p,
                         toks._M_elems[1]._M_dataplus._M_p + toks._M_elems[1]._M_string_length);
              PrimSpec::PrimSpec(&variant);
              pmVar13 = ::std::
                        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::at(&this_02->_variantPropChildren,&current_local);
              piVar36 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              local_d38 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              local_d50 = (map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                           *)CONCAT71(local_d50._1_7_,piVar36 == local_d38);
              if (piVar36 != local_d38) {
                this_03 = &this_02->_variantProps;
                local_c88 = this_03;
                do {
                  sVar14 = ::std::
                           map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                           ::count(this_03,piVar36);
                  if (sVar14 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&prop_name);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                               ,0x55);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,"ReconstructPrimSpecRecursively",0x1e);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,"():",3);
                    poVar8 = (ostream *)::std::ostream::operator<<(&prop_name,0xe30);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,"Internal error: variant Property not found.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&prop_name,"\n",1);
                    ::std::__cxx11::stringbuf::str();
                    PushError(this_02,&__str_1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                      operator_delete(__str_1._M_dataplus._M_p,
                                      __str_1.field_2._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop_name);
                    ::std::ios_base::~ios_base(local_c10);
                  }
                  else {
                    local_d48 = sVar14;
                    pmVar15 = ::std::
                              map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                              ::at(this_03,piVar36);
                    prop_name._M_dataplus._M_p = (pointer)&prop_name.field_2;
                    pcVar4 = (pmVar15->first)._prop_part._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&prop_name,pcVar4,
                               pcVar4 + (pmVar15->first)._prop_part._M_string_length);
                    pmVar16 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                              ::operator[](&variant._props,&prop_name);
                    ::std::__cxx11::string::_M_assign((string *)pmVar16);
                    (pmVar16->_attrib)._varying_authored =
                         (pmVar15->second)._attrib._varying_authored;
                    (pmVar16->_attrib)._variability = (pmVar15->second)._attrib._variability;
                    ::std::__cxx11::string::_M_assign((string *)&(pmVar16->_attrib)._type_name);
                    linb::any::operator=
                              ((any *)&(pmVar16->_attrib)._var,
                               (any *)&(pmVar15->second)._attrib._var);
                    (pmVar16->_attrib)._var._blocked = (pmVar15->second)._attrib._var._blocked;
                    ::std::
                    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ::operator=(&(pmVar16->_attrib)._var._ts._samples,
                                &(pmVar15->second)._attrib._var._ts._samples);
                    (pmVar16->_attrib)._var._ts._dirty = (pmVar15->second)._attrib._var._ts._dirty;
                    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &(pmVar16->_attrib)._paths,
                               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &(pmVar15->second)._attrib._paths);
                    AttrMetas::operator=
                              (&(pmVar16->_attrib)._metas,&(pmVar15->second)._attrib._metas);
                    TVar5 = (pmVar15->second)._type;
                    pmVar16->_listOpQual = (pmVar15->second)._listOpQual;
                    pmVar16->_type = TVar5;
                    (pmVar16->_rel).type = (pmVar15->second)._rel.type;
                    Path::operator=(&(pmVar16->_rel).targetPath,&(pmVar15->second)._rel.targetPath);
                    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &(pmVar16->_rel).targetPathVector,
                               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &(pmVar15->second)._rel.targetPathVector);
                    (pmVar16->_rel).listOpQual = (pmVar15->second)._rel.listOpQual;
                    AttrMetas::operator=(&(pmVar16->_rel)._metas,&(pmVar15->second)._rel._metas);
                    (pmVar16->_rel)._varying_authored = (pmVar15->second)._rel._varying_authored;
                    ::std::__cxx11::string::_M_assign((string *)&pmVar16->_prop_value_type_name);
                    pmVar16->_has_custom = (pmVar15->second)._has_custom;
                    sVar14 = local_d48;
                    this_03 = local_c88;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
                      operator_delete(prop_name._M_dataplus._M_p,
                                      prop_name.field_2._M_allocated_capacity + 1);
                      sVar14 = local_d48;
                      this_03 = local_c88;
                    }
                  }
                  if (sVar14 == 0) goto LAB_00194558;
                  piVar36 = piVar36 + 1;
                  local_d50 = (map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                               *)CONCAT71(local_d50._1_7_,piVar36 == local_d38);
                } while (piVar36 != local_d38);
              }
              pmVar17 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                        ::operator[](&local_d30->_variantSets,&variantSetName);
              if ((pmVar17->name)._M_string_length == 0) {
                ::std::__cxx11::string::_M_assign((string *)pmVar17);
              }
              pmVar18 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                        ::operator[](&pmVar17->variantSet,&__str);
              if (pmVar18 != &variant) {
                PrimSpec::CopyFrom(pmVar18,&variant);
              }
LAB_00194558:
              PrimSpec::~PrimSpec(&variant);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)variantSetName._M_dataplus._M_p != &variantSetName.field_2) {
                operator_delete(variantSetName._M_dataplus._M_p,
                                variantSetName.field_2._M_allocated_capacity + 1);
              }
              lVar9 = -0x40;
              paVar37 = &toks._M_elems[1].field_2;
              do {
                plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(paVar37 + -1))->_M_dataplus)._M_p;
                if (paVar37 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar21) {
                  operator_delete(plVar21,paVar37->_M_allocated_capacity + 1);
                }
                paVar37 = paVar37 + -2;
                lVar9 = lVar9 + 0x20;
              } while (lVar9 != 0);
              if (((ulong)local_d50 & 1) != 0) goto LAB_001945e6;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&variant,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<(&variant,0xe25);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&variant,"Invalid variant element_name.",0x1d);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushError(this_02,&prop_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
                operator_delete(prop_name._M_dataplus._M_p,
                                prop_name.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
              ::std::ios_base::~ios_base
                        ((ios_base *)
                         &variant._props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
              lVar9 = -0x40;
              paVar37 = &toks._M_elems[1].field_2;
              do {
                plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(paVar37 + -1))->_M_dataplus)._M_p;
                if (paVar37 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar21) {
                  operator_delete(plVar21,paVar37->_M_allocated_capacity + 1);
                }
                paVar37 = paVar37 + -2;
                lVar9 = lVar9 + 0x20;
              } while (lVar9 != 0);
            }
            goto LAB_001951d3;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&variant,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<(&variant,0xe20);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          pcVar33 = "Corrupted Crate. VariantAttribute is not the child of VariantPrim.";
          lVar9 = 0x42;
        }
LAB_00195153:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,pcVar33,lVar9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
        ::std::__cxx11::stringbuf::str();
LAB_0019518a:
        PushError(this_02,&prop_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
          operator_delete(prop_name._M_dataplus._M_p,prop_name.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
        ::std::ios_base::~ios_base
                  ((ios_base *)
                   &variant._props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      }
LAB_001951d3:
      bVar7 = false;
LAB_001951d5:
      if (primspec.has_value_ != true) {
        return bVar7;
      }
      PrimSpec::~PrimSpec((PrimSpec *)&primspec.contained);
      return bVar7;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&primspec);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&primspec,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&primspec,"ReconstructPrimSpecRecursively",0x1e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"():",3);
    poVar8 = (ostream *)::std::ostream::operator<<(&primspec,0xdd9);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    __val = -current_local;
    if (0 < current_local) {
      __val = current_local;
    }
    __len = 1;
    if (9 < __val) {
      uVar30 = (ulong)__val;
      uVar34 = 4;
      do {
        __len = uVar34;
        uVar23 = (uint)uVar30;
        if (uVar23 < 100) {
          __len = __len - 2;
          goto LAB_00194ae9;
        }
        if (uVar23 < 1000) {
          __len = __len - 1;
          goto LAB_00194ae9;
        }
        if (uVar23 < 10000) goto LAB_00194ae9;
        uVar30 = uVar30 / 10000;
        uVar34 = __len + 4;
      } while (99999 < uVar23);
      __len = __len + 1;
    }
LAB_00194ae9:
    uVar34 = (uint)current_local >> 0x1f;
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&__str,(char)__len - (char)(current_local >> 0x1f));
    ::std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p + uVar34,__len,__val);
    plVar21 = (long *)::std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3f23da);
    psVar27 = (size_type *)(plVar21 + 2);
    if ((size_type *)*plVar21 == psVar27) {
      variantSetName.field_2._M_allocated_capacity = *psVar27;
      variantSetName.field_2._8_8_ = plVar21[3];
      variantSetName._M_dataplus._M_p = (pointer)&variantSetName.field_2;
    }
    else {
      variantSetName.field_2._M_allocated_capacity = *psVar27;
      variantSetName._M_dataplus._M_p = (pointer)*plVar21;
    }
    variantSetName._M_string_length = plVar21[1];
    *plVar21 = (long)psVar27;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    plVar21 = (long *)::std::__cxx11::string::append((char *)&variantSetName);
    paVar37 = &toks._M_elems[0].field_2;
    psVar27 = (size_type *)(plVar21 + 2);
    if ((size_type *)*plVar21 == psVar27) {
      toks._M_elems[0].field_2._M_allocated_capacity = *psVar27;
      toks._M_elems[0].field_2._8_8_ = plVar21[3];
      toks._M_elems[0]._M_dataplus._M_p = (pointer)paVar37;
    }
    else {
      toks._M_elems[0].field_2._M_allocated_capacity = *psVar27;
      toks._M_elems[0]._M_dataplus._M_p = (pointer)*plVar21;
    }
    toks._M_elems[0]._M_string_length = plVar21[1];
    *plVar21 = (long)psVar27;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    uVar30 = ((long)(this->_nodes).
                    super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_nodes).
                    super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1041041041041041;
    cVar31 = '\x01';
    if (9 < uVar30) {
      uVar28 = uVar30;
      cVar6 = '\x04';
      do {
        cVar31 = cVar6;
        if (uVar28 < 100) {
          cVar31 = cVar31 + -2;
          goto LAB_00194c5a;
        }
        if (uVar28 < 1000) {
          cVar31 = cVar31 + -1;
          goto LAB_00194c5a;
        }
        if (uVar28 < 10000) goto LAB_00194c5a;
        bVar7 = 99999 < uVar28;
        uVar28 = uVar28 / 10000;
        cVar6 = cVar31 + '\x04';
      } while (bVar7);
      cVar31 = cVar31 + '\x01';
    }
LAB_00194c5a:
    paVar2 = &__str_1.field_2;
    __str_1._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar31);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar30);
    uVar30 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
             toks._M_elems[0]._M_string_length;
    uVar32 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)toks._M_elems[0]._M_dataplus._M_p != paVar37) {
      uVar32 = toks._M_elems[0].field_2._M_allocated_capacity;
    }
    if ((ulong)uVar32 < uVar30) {
      uVar32 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar2) {
        uVar32 = __str_1.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar32 < uVar30) goto LAB_00194ccc;
      puVar22 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&__str_1,0,(char *)0x0,(ulong)toks._M_elems[0]._M_dataplus._M_p);
    }
    else {
LAB_00194ccc:
      puVar22 = (undefined8 *)
                ::std::__cxx11::string::_M_append((char *)&toks,(ulong)__str_1._M_dataplus._M_p);
    }
    prop_name._M_dataplus._M_p = (pointer)&prop_name.field_2;
    psVar27 = puVar22 + 2;
    if ((size_type *)*puVar22 == psVar27) {
      prop_name.field_2._M_allocated_capacity = *psVar27;
      prop_name.field_2._8_8_ = puVar22[3];
    }
    else {
      prop_name.field_2._M_allocated_capacity = *psVar27;
      prop_name._M_dataplus._M_p = (pointer)*puVar22;
    }
    prop_name._M_string_length = puVar22[1];
    *puVar22 = psVar27;
    puVar22[1] = 0;
    *(char *)psVar27 = '\0';
    plVar21 = (long *)::std::__cxx11::string::append((char *)&prop_name);
    psVar27 = &variant._typeName._M_string_length;
    psVar29 = (size_type *)(plVar21 + 2);
    if ((size_type *)*plVar21 == psVar29) {
      variant._typeName._M_string_length = *psVar29;
      variant._typeName.field_2._M_allocated_capacity = plVar21[3];
      variant._0_8_ = psVar27;
    }
    else {
      variant._typeName._M_string_length = *psVar29;
      variant._0_8_ = (size_type *)*plVar21;
    }
    variant._typeName._M_dataplus._M_p = (pointer)plVar21[1];
    *plVar21 = (long)psVar29;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&primspec,(char *)variant._0_8_,
                        (long)variant._typeName._M_dataplus._M_p);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    if ((size_type *)variant._0_8_ != psVar27) {
      operator_delete((void *)variant._0_8_,variant._typeName._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
      operator_delete(prop_name._M_dataplus._M_p,prop_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar2) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)toks._M_elems[0]._M_dataplus._M_p != paVar37) {
      operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                      toks._M_elems[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)variantSetName._M_dataplus._M_p != &variantSetName.field_2) {
      operator_delete(variantSetName._M_dataplus._M_p,
                      variantSetName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&variant);
    if ((size_type *)variant._0_8_ == psVar27) goto LAB_00193ecf;
  }
  operator_delete((void *)variant._0_8_,variant._typeName._M_string_length + 1);
LAB_00193ecf:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&primspec);
  ::std::ios_base::~ios_base((ios_base *)((long)&primspec.contained + 0x68));
  return false;
}

Assistant:

bool USDCReader::Impl::ReconstructPrimSpecRecursively(
    int parent, int current, PrimSpec *parentPrimSpec, int level,
    const PathIndexToSpecIndexMap &psmap, Layer *layer) {
  if (level > int32_t(_config.kMaxPrimNestLevel)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "PrimSpec hierarchy is too deep.");
  }

  DCOUT("ReconstructPrimRecursively: parent = "
        << std::to_string(parent) << ", current = " << current
        << ", level = " << std::to_string(level));

  if ((current < 0) || (current >= int(_nodes.size()))) {
    PUSH_ERROR("Invalid current node id: " + std::to_string(current) +
               ". Must be in range [0, " + std::to_string(_nodes.size()) + ")");
    return false;
  }

  // TODO: Refactor

  // null : parent node is Property or other Spec type.
  // non-null : parent node is PrimSpec
  PrimSpec *currPrimSpecPtr = nullptr;
  nonstd::optional<PrimSpec> primspec;

  // Assume parent node is already processed.
  bool is_parent_variant = _variantPrims.count(parent);

  if (!ReconstructPrimSpecNode(parent, current, level, is_parent_variant, psmap,
                           layer, &primspec)) {
    return false;
  }

  if (primspec) {
    currPrimSpecPtr = &(primspec.value());
  }

  {
    const crate::CrateReader::Node &node = _nodes[size_t(current)];
    DCOUT("node.Children.size = " << node.GetChildren().size());
    for (size_t i = 0; i < node.GetChildren().size(); i++) {
      DCOUT("Reconstuct Prim children: " << i << " / "
                                         << node.GetChildren().size());
      if (!ReconstructPrimSpecRecursively(current, int(node.GetChildren()[i]),
                                      currPrimSpecPtr, level + 1, psmap, layer)) {
        return false;
      }
      DCOUT("DONE Reconstuct PrimSpec children: " << i << " / "
                                              << node.GetChildren().size());
    }
  }

  //
  // Reonstruct variant
  //
  DCOUT(fmt::format("parent {}, current {}", parent, current));

  DCOUT(fmt::format("  has variant properties {}, has variant children {}",
    _variantPropChildren.count(current),
    _variantPrimChildren.count(current)));

  if (_variantPropChildren.count(current)) {

    // - parentPrim
    //   - variantPrim(SpecTypeVariant) <- current
    //     - variant property(SpecTypeAttribute)

    //
    // `current` must be VariantPrim and `parentPrim` should exist
    //
    if (!_variantPrims.count(current)) {
      PUSH_ERROR_AND_RETURN("Internal error: variant attribute is not a child of VariantPrim.");
    }

    if (!parentPrimSpec) {
      PUSH_ERROR_AND_RETURN("Internal error: parentPrimSpec should exist.");
    }

    const Prim &variantPrim = _variantPrims.at(current);

    DCOUT("variant prim name: " << variantPrim.element_name());


    // element_name must be variant: "{variant=value}"
    if (!is_variantElementName(variantPrim.element_name())) {
      PUSH_ERROR_AND_RETURN("Corrupted Crate. VariantAttribute is not the child of VariantPrim.");
    }

    std::array<std::string, 2> toks;
    if (!tokenize_variantElement(variantPrim.element_name(), &toks)) {
      PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
    }

    std::string variantSetName = toks[0];
    std::string variantName = toks[1];

    PrimSpec variant;

    for (const auto &item : _variantPropChildren.at(current)) {
      // item should exist in _variantProps.
      if (!_variantProps.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Property not found.");
      }
      const std::pair<Path, Property> &pp = _variantProps.at(item);

      std::string prop_name = std::get<0>(pp).prop_part();
      DCOUT(fmt::format("  node_index = {}, prop name {}", item, prop_name));

      variant.props()[prop_name] = std::get<1>(pp);
    }

    VariantSetSpec &vs = parentPrimSpec->variantSets()[variantSetName];

    if (vs.name.empty()) {
      vs.name = variantSetName;
    }
    vs.variantSet[variantName] = variant;

  }

  if (_variantPrimChildren.count(current)) {

    // - currentPrim <- current
    //   - variant Prim children

    if (!primspec) {
      PUSH_ERROR_AND_RETURN("Internal error: must be Prim.");
    }

    DCOUT(fmt::format("{} has variant PrimSpec ", primspec->name()));


    for (const auto &item : _variantPrimChildren.at(current)) {

      if (!_variantPrimSpecs.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Prim children not found.");
      }

      const PrimSpec &vp = _variantPrimSpecs.at(item);

      DCOUT(fmt::format("  variantPrim name {}", vp.name()));

      // element_name must be variant: "{variant=value}"
      if (!is_variantElementName(vp.name())) {
        PUSH_ERROR_AND_RETURN("Corrupted Crate. Variant Prim has invalid element_name.");
      }

      std::array<std::string, 2> toks;
      if (!tokenize_variantElement(vp.name(), &toks)) {
        PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
      }

      std::string variantSetName = toks[0];
      std::string variantName = toks[1];

      VariantSetSpec &vs = primspec->variantSets()[variantSetName];

      if (vs.name.empty()) {
        vs.name = variantSetName;
      }
      vs.variantSet[variantName].metas() = vp.metas();
      DCOUT("# of primChildren = " << vp.children().size());
      vs.variantSet[variantName].children() = std::move(vp.children());

    }
  }

  if (parent == 0) {  // root prim
    if (primspec) {
      layer->primspecs()[primspec.value().name()] = std::move(primspec.value());
    }
  } else {
    if (_variantPrimSpecs.count(parent)) {
      // Add to variantPrim
      DCOUT("parent is variantPrim: " << parent);
      if (!primspec) {
        // FIXME: Validate current should be Prim.
        PUSH_WARN("parent is variantPrim, but current is not Prim.");
      } else {
        DCOUT("Adding prim to child...");
        PrimSpec &vps = _variantPrimSpecs.at(parent);
        vps.children().emplace_back(std::move(primspec.value()));
      }
    } else if (primspec && parentPrimSpec) {
      // Add to parent prim.
      parentPrimSpec->children().emplace_back(std::move(primspec.value()));
    }
  }

  return true;
}